

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::DistWeightSyntax::setChild(DistWeightSyntax *this,size_t index,TokenOrSyntax child)

{
  Info *pIVar1;
  undefined1 uVar2;
  NumericTokenFlags NVar3;
  uint32_t uVar4;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar5;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar6;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar7;
  
  if (index == 2) {
    ppSVar6 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar6 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pSVar7 = (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0;
    }
    else {
      ppSVar6 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pSVar7 = *ppSVar6;
    }
    (this->expr).ptr = (ExpressionSyntax *)pSVar7;
  }
  else if (index == 1) {
    pvVar5 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar2 = pvVar5->field_0x2;
    NVar3.raw = (pvVar5->numFlags).raw;
    uVar4 = pvVar5->rawLen;
    pIVar1 = pvVar5->info;
    (this->extraOp).kind = pvVar5->kind;
    (this->extraOp).field_0x2 = uVar2;
    (this->extraOp).numFlags = (NumericTokenFlags)NVar3.raw;
    (this->extraOp).rawLen = uVar4;
    (this->extraOp).info = pIVar1;
  }
  else {
    pvVar5 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar2 = pvVar5->field_0x2;
    NVar3.raw = (pvVar5->numFlags).raw;
    uVar4 = pvVar5->rawLen;
    pIVar1 = pvVar5->info;
    (this->op).kind = pvVar5->kind;
    (this->op).field_0x2 = uVar2;
    (this->op).numFlags = (NumericTokenFlags)NVar3.raw;
    (this->op).rawLen = uVar4;
    (this->op).info = pIVar1;
  }
  return;
}

Assistant:

void DistWeightSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: op = child.token(); return;
        case 1: extraOp = child.token(); return;
        case 2: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}